

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O3

void __thiscall chrono::ChFile_ps::DrawGraphAxes(ChFile_ps *this,ChFile_ps_graph_setting *msetting)

{
  ChStreamOutAscii *this_00;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  double adVar9 [2];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ChStreamOutAscii *pCVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  char numstr [20];
  undefined1 local_218 [16];
  double local_208;
  double dStack_200;
  double local_1e8;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  ChVector2<double> local_198;
  ChVector2<double> local_188;
  ChVector2<double> local_178;
  ChVector2<double> local_168;
  ChVector2<double> local_158 [2];
  ChVector2<double> local_138;
  ChVector2<double> local_128;
  ChVector2<double> local_118;
  ChVector2<double> local_108;
  ChVector2<double> local_f8;
  ChVector2<double> local_e8;
  ChVector2<double> local_d8;
  ChVector2<double> local_c8;
  ChVector2<double> local_b8;
  ChVector2<double> local_a8;
  ChVector2<double> local_98;
  ChVector2<double> local_88;
  ChVector2<double> local_70;
  ChVector2<double> local_60;
  ChVector2<double> local_50;
  ChVector2<double> local_40;
  
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  ChStreamOutAscii::operator<<(this_00,"GS\n");
  dVar1 = (this->Gs_p).m_data[0];
  dVar15 = (this->G_p).m_data[0];
  dVar16 = (this->Gs_p).m_data[1];
  dVar2 = (this->G_p).m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (this->Gc_g).m_data[0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = (this->Gc_g).m_data[1];
  auVar35._0_8_ = 1.0 / (this->Gz).m_data[0];
  auVar35._8_8_ = 0;
  auVar34._0_8_ = 1.0 / (this->Gz).m_data[1];
  auVar34._8_8_ = 0;
  dVar6 = dVar15 + dVar1 * 0.5;
  dVar7 = dVar2 + dVar16 * 0.5;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (dVar15 + dVar1) - dVar6;
  auVar17 = vfmadd213sd_fma(auVar17,auVar35,auVar14);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar15 - dVar6;
  auVar35 = vfmadd213sd_fma(auVar36,auVar35,auVar14);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar2 - dVar7;
  auVar14 = vfmadd213sd_fma(auVar37,auVar34,auVar38);
  dVar15 = auVar17._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (dVar2 + dVar16) - dVar7;
  auVar17 = vfmadd213sd_fma(auVar13,auVar34,auVar38);
  dVar16 = auVar17._0_8_;
  ChStreamOutAscii::operator<<(this_00,"GS\n");
  local_158[0].m_data[0] = (this->G_p).m_data[0];
  local_158[0].m_data[1] = (this->G_p).m_data[1];
  local_88.m_data[0] = (this->Gs_p).m_data[0];
  local_88.m_data[1] = (this->Gs_p).m_data[1];
  ClipRectangle(this,local_158,&local_88,PAGE);
  SetFont(this,"/Helvetica",(msetting->Xaxis).numbers_fontsize);
  dVar1 = (msetting->Xaxis).ticks_step;
  local_1b8 = auVar35._0_8_;
  uStack_1b0 = auVar35._8_8_;
  auVar19._0_8_ = local_1b8 / dVar1;
  auVar19._8_8_ = uStack_1b0;
  auVar17 = vroundsd_avx(auVar19,auVar19,10);
  local_218._0_8_ = dVar1 * auVar17._0_8_;
  if ((double)local_218._0_8_ < dVar15) {
    do {
      local_218._8_8_ = 0;
      if (200.0 < (dVar15 - local_1b8) / dVar1) break;
      if (msetting->gridx == true) {
        auVar17 = vunpcklpd_avx(local_218,auVar14);
        auVar17 = vsubpd_avx(auVar17,*(undefined1 (*) [16])(this->Gc_g).m_data);
        auVar20._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar20._8_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        adVar9 = (double  [2])
                 vfmadd132pd_fma(auVar17,auVar20,*(undefined1 (*) [16])(this->Gz).m_data);
        auVar17 = vshufpd_avx(auVar20,auVar20,1);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (this->Gz).m_data[1];
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar16 - (this->Gc_g).m_data[1];
        auVar17 = vfmadd231sd_fma(auVar17,auVar29,auVar3);
        pCVar12 = ChStreamOutAscii::operator<<(this_00,msetting->grid_width);
        ChStreamOutAscii::operator<<(pCVar12," LW\n");
        SetRGB(this,(msetting->grid_color).r,(msetting->grid_color).g,(msetting->grid_color).b);
        local_168.m_data[0] = (double)vmovlps_avx((undefined1  [16])adVar9);
        local_1e8 = auVar17._0_8_;
        local_168.m_data[1] = local_1e8;
        local_e8.m_data = adVar9;
        DrawLine(this,&local_e8,&local_168,PAGE);
      }
      if ((msetting->Xaxis).ticks == true) {
        auVar30._8_8_ = 0;
        auVar30._0_8_ = local_218._0_8_;
        auVar17 = vsubpd_avx(auVar30,*(undefined1 (*) [16])(this->Gc_g).m_data);
        auVar21._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar21._8_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        adVar9 = (double  [2])
                 vfmadd132pd_fma(auVar17,auVar21,*(undefined1 (*) [16])(this->Gz).m_data);
        auVar17 = vshufpd_avx((undefined1  [16])adVar9,(undefined1  [16])adVar9,1);
        pCVar12 = ChStreamOutAscii::operator<<(this_00,(msetting->Xaxis).ticks_width);
        ChStreamOutAscii::operator<<(pCVar12," LW\n");
        SetRGB(this,(msetting->Xaxis).axis_color.r,(msetting->Xaxis).axis_color.g,
               (msetting->Xaxis).axis_color.b);
        local_178.m_data[0] = (double)vmovlpd_avx((undefined1  [16])adVar9);
        local_178.m_data[1] = auVar17._0_8_ + 0.1;
        local_f8.m_data = adVar9;
        DrawLine(this,&local_f8,&local_178,PAGE);
      }
      if ((msetting->Xaxis).numbers == true) {
        SetRGB(this,(msetting->Xaxis).numbers_color.r,(msetting->Xaxis).numbers_color.g,
               (msetting->Xaxis).numbers_color.b);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (this->Gz).m_data[0];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar22._8_8_ = 0;
        auVar22._0_8_ = (double)local_218._0_8_ - (this->Gc_g).m_data[0];
        auVar17 = vfmadd132sd_fma(auVar22,auVar18,auVar4);
        auVar10._8_8_ = 0x7fffffffffffffff;
        auVar10._0_8_ = 0x7fffffffffffffff;
        auVar13 = vandpd_avx512vl(local_218,auVar10);
        uVar8 = vcmpsd_avx512f(auVar13,ZEXT816(0x3cd203af9ee75616),1);
        auVar17 = vmovhpd_avx(auVar17,(this->G_p).m_data[1]);
        sprintf((char *)local_158,
                (this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii.number_format,
                (ulong)!(bool)((byte)uVar8 & 1) * local_218._0_8_);
        local_208 = auVar17._0_8_;
        dStack_200 = auVar17._8_8_;
        local_108.m_data[0] = local_208 + 0.1;
        local_108.m_data[1] = dStack_200 + 0.16;
        DrawText(this,&local_108,(char *)local_158,PAGE,LEFT);
      }
      dVar1 = (msetting->Xaxis).ticks_step;
      local_218._0_8_ = (double)local_218._0_8_ + dVar1;
    } while ((double)local_218._0_8_ < dVar15);
  }
  SetFont(this,"/Helvetica",(msetting->Yaxis).numbers_fontsize);
  dVar1 = (msetting->Yaxis).ticks_step;
  local_1a8 = auVar14._0_8_;
  uStack_1a0 = auVar14._8_8_;
  auVar23._0_8_ = local_1a8 / dVar1;
  auVar23._8_8_ = uStack_1a0;
  auVar17 = vroundsd_avx(auVar23,auVar23,10);
  local_218._0_8_ = dVar1 * auVar17._0_8_;
  if ((double)local_218._0_8_ < dVar16) {
    do {
      local_218._8_8_ = 0;
      if (200.0 < (dVar16 - local_1a8) / dVar1) break;
      if (msetting->gridy == true) {
        auVar17 = *(undefined1 (*) [16])(this->Gc_g).m_data;
        auVar14 = *(undefined1 (*) [16])(this->Gz).m_data;
        auVar13 = vunpcklpd_avx(auVar35,local_218);
        auVar32._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar32._8_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        auVar13 = vsubpd_avx(auVar13,auVar17);
        adVar9 = (double  [2])vfmadd213pd_fma(auVar13,auVar14,auVar32);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar15 - auVar17._0_8_;
        auVar17 = vfmadd213sd_fma(auVar24,auVar14,auVar32);
        pCVar12 = ChStreamOutAscii::operator<<(this_00,msetting->grid_width);
        ChStreamOutAscii::operator<<(pCVar12," LW\n");
        SetRGB(this,(msetting->grid_color).r,(msetting->grid_color).g,(msetting->grid_color).b);
        local_188.m_data[1] = (double)vmovhpd_avx((undefined1  [16])adVar9);
        local_188.m_data[0] = auVar17._0_8_;
        local_118.m_data = adVar9;
        DrawLine(this,&local_118,&local_188,PAGE);
      }
      if ((msetting->Yaxis).ticks == true) {
        auVar17 = vunpcklpd_avx(ZEXT816(0) << 0x40,local_218);
        auVar17 = vsubpd_avx(auVar17,*(undefined1 (*) [16])(this->Gc_g).m_data);
        auVar25._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar25._8_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        adVar9 = (double  [2])
                 vfmadd132pd_fma(auVar17,auVar25,*(undefined1 (*) [16])(this->Gz).m_data);
        pCVar12 = ChStreamOutAscii::operator<<(this_00,(msetting->Yaxis).ticks_width);
        ChStreamOutAscii::operator<<(pCVar12," LW\n");
        SetRGB(this,(msetting->Yaxis).axis_color.r,(msetting->Yaxis).axis_color.g,
               (msetting->Yaxis).axis_color.b);
        local_198.m_data[1] = (double)vmovhpd_avx((undefined1  [16])adVar9);
        local_198.m_data[0] = adVar9[0] + 0.1;
        local_128.m_data = adVar9;
        DrawLine(this,&local_128,&local_198,PAGE);
      }
      if ((msetting->Yaxis).numbers == true) {
        SetRGB(this,(msetting->Yaxis).numbers_color.r,(msetting->Yaxis).numbers_color.g,
               (msetting->Yaxis).numbers_color.b);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (this->Gz).m_data[1];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (double)local_218._0_8_ - (this->Gc_g).m_data[1];
        auVar17 = vfmadd132sd_fma(auVar31,auVar26,auVar5);
        auVar17 = vunpcklpd_avx(*(undefined1 (*) [16])(this->G_p).m_data,auVar17);
        auVar11._8_8_ = 0x7fffffffffffffff;
        auVar11._0_8_ = 0x7fffffffffffffff;
        auVar14 = vandpd_avx512vl(local_218,auVar11);
        uVar8 = vcmpsd_avx512f(auVar14,ZEXT816(0x3cd203af9ee75616),1);
        sprintf((char *)local_158,
                (this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii.number_format,
                (ulong)!(bool)((byte)uVar8 & 1) * local_218._0_8_);
        local_208 = auVar17._0_8_;
        dStack_200 = auVar17._8_8_;
        local_138.m_data[0] = local_208 + 0.16;
        local_138.m_data[1] = dStack_200 + 0.1;
        DrawText(this,&local_138,(char *)local_158,PAGE,LEFT);
      }
      dVar1 = (msetting->Yaxis).ticks_step;
      local_218._0_8_ = (double)local_218._0_8_ + dVar1;
    } while ((double)local_218._0_8_ < dVar16);
  }
  pCVar12 = ChStreamOutAscii::operator<<(this_00,(msetting->Xaxis).axis_width);
  ChStreamOutAscii::operator<<(pCVar12," LW\n");
  SetRGB(this,(msetting->Xaxis).axis_color.r,(msetting->Xaxis).axis_color.g,
         (msetting->Xaxis).axis_color.b);
  local_40.m_data[0] = local_1b8;
  local_40.m_data[1] = 0.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[0] = dVar15;
  DrawLine(this,&local_40,&local_50,GRAPH);
  pCVar12 = ChStreamOutAscii::operator<<(this_00,(msetting->Yaxis).axis_width);
  ChStreamOutAscii::operator<<(pCVar12," LW\n");
  SetRGB(this,(msetting->Yaxis).axis_color.r,(msetting->Yaxis).axis_color.g,
         (msetting->Yaxis).axis_color.b);
  local_60.m_data[0] = 0.0;
  local_70.m_data[0] = 0.0;
  local_60.m_data[1] = local_1a8;
  local_70.m_data[1] = dVar16;
  DrawLine(this,&local_60,&local_70,GRAPH);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (this->G_p).m_data[0] + (this->Gs_p).m_data[0];
  auVar17 = vmovhpd_avx(auVar33,(this->G_p).m_data[1]);
  SetRGB(this,(msetting->Xaxis).label_color.r,(msetting->Xaxis).label_color.g,
         (msetting->Xaxis).label_color.b);
  SetFont(this,*(char **)(ch_font_labels + (long)(msetting->Xaxis).label_fontname * 8),
          (msetting->Xaxis).label_fontsize);
  local_218._0_8_ = auVar17._0_8_;
  local_218._8_8_ = auVar17._8_8_;
  local_98.m_data[0] = (double)local_218._0_8_ + -0.4;
  local_98.m_data[1] = (double)local_218._8_8_ + 0.4;
  DrawText(this,&local_98,(msetting->Xaxis).label,PAGE,RIGHT);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = (this->G_p).m_data[1] + (this->Gs_p).m_data[1];
  auVar17 = vunpcklpd_avx(*(undefined1 (*) [16])(this->G_p).m_data,auVar27);
  SetRGB(this,(msetting->Yaxis).label_color.r,(msetting->Yaxis).label_color.g,
         (msetting->Yaxis).label_color.b);
  SetFont(this,*(char **)(ch_font_labels + (long)(msetting->Yaxis).label_fontname * 8),
          (msetting->Yaxis).label_fontsize);
  local_218._0_8_ = auVar17._0_8_;
  local_218._8_8_ = auVar17._8_8_;
  local_a8.m_data[0] = (double)local_218._0_8_ + 0.7;
  local_a8.m_data[1] = (double)local_218._8_8_ + -0.3;
  DrawText(this,&local_a8,(msetting->Yaxis).label,PAGE,LEFT);
  ChStreamOutAscii::operator<<(this_00,"GR\n");
  pCVar12 = ChStreamOutAscii::operator<<(this_00,0.0);
  ChStreamOutAscii::operator<<(pCVar12," SG\n");
  local_b8.m_data[0] = (this->G_p).m_data[0];
  local_b8.m_data[1] = (this->G_p).m_data[1];
  local_c8.m_data[0] = (this->Gs_p).m_data[0];
  local_c8.m_data[1] = (this->Gs_p).m_data[1];
  DrawRectangle(this,&local_b8,&local_c8,PAGE,false);
  if (msetting->title[0] != '\0') {
    SetFont(this,*(char **)(ch_font_labels + (long)msetting->title_fontname * 8),
            msetting->title_fontsize);
    SetRGB(this,(msetting->title_color).r,(msetting->title_color).g,(msetting->title_color).b);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = (this->G_p).m_data[1] + (this->Gs_p).m_data[1];
    auVar35 = vunpcklpd_avx(*(undefined1 (*) [16])(this->G_p).m_data,auVar28);
    auVar17 = vmovhpd_avx(ZEXT816(0),0x3fd999999999999a);
    local_d8.m_data[0] = auVar35._0_8_ + auVar17._0_8_;
    local_d8.m_data[1] = auVar35._8_8_ + auVar17._8_8_;
    DrawText(this,&local_d8,msetting->title,PAGE,LEFT);
  }
  ChStreamOutAscii::operator<<(this_00,"GR\n");
  return;
}

Assistant:

void ChFile_ps::DrawGraphAxes(ChFile_ps_graph_setting* msetting) {
    ChVector2<> cpt, cp1, cp2, lole_g, upri_g, org_g, org_p;

    // save old gfx mode
    GrSave();

    // some coords
    lole_g = To_graph_from_page(G_p);
    cpt.x() = G_p.x() + Gs_p.x();
    cpt.y() = G_p.y() + Gs_p.y();
    upri_g = To_graph_from_page(cpt);
    org_g.x() = org_g.y() = 0;
    org_p = To_page_from_graph(org_g);

    // Set clip region
    GrSave();
    ClipToGraph();  // ClipRectangle(G_p,Gs_p,PS_SPACE_PAGE);

    // X AXIS ticks, grid numbers
    //

    SetFont((char*)"/Helvetica", msetting->Xaxis.numbers_fontsize);

    double stpx = ceil(lole_g.x() / msetting->Xaxis.ticks_step) * msetting->Xaxis.ticks_step;
    for (double w = stpx; w < upri_g.x(); w += msetting->Xaxis.ticks_step) {
        if ((upri_g.x() - lole_g.x()) / msetting->Xaxis.ticks_step > 200.0)
            break;
        cpt.x() = w;
        cpt.y() = 0;
        if (msetting->gridx) {
            cp1 = cpt;
            cp2 = cp1;
            cp1.y() = lole_g.y();
            cp2.y() = upri_g.y();
            cp1 = To_page_from_graph(cp1);
            cp2 = To_page_from_graph(cp2);
            SetWidth(msetting->grid_width);
            SetRGB(msetting->grid_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Xaxis.ticks) {
            cp1 = To_page_from_graph(cpt);
            cp2.x() = cp1.x();
            cp2.y() = cp1.y() + 0.10;
            SetWidth(msetting->Xaxis.ticks_width);
            SetRGB(msetting->Xaxis.axis_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Xaxis.numbers) {
            char numstr[20];
            SetRGB(msetting->Xaxis.numbers_color);
            cp1 = To_page_from_graph(cpt);
            cp1.y() = G_p.y() + 0.16;
            cp1.x() = cp1.x() + 0.1;
            double tw = w;
            if (fabs(w) < 1.e-15)
                tw = 0;
            sprintf(numstr, this->number_format, tw);
            DrawText(cp1, numstr, Space::PAGE);
        }
    }

    // Y AXIS grid, numbers, ticks
    //

    SetFont((char*)"/Helvetica", msetting->Yaxis.numbers_fontsize);

    double stpy = ceil(lole_g.y() / msetting->Yaxis.ticks_step) * msetting->Yaxis.ticks_step;
    for (double h = stpy; h < upri_g.y(); h += msetting->Yaxis.ticks_step) {
        if ((upri_g.y() - lole_g.y()) / msetting->Yaxis.ticks_step > 200.0)
            break;
        cpt.x() = 0;
        cpt.y() = h;
        if (msetting->gridy) {
            cp1 = cpt;
            cp2 = cp1;
            cp1.x() = lole_g.x();
            cp2.x() = upri_g.x();
            cp1 = To_page_from_graph(cp1);
            cp2 = To_page_from_graph(cp2);
            SetWidth(msetting->grid_width);
            SetRGB(msetting->grid_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Yaxis.ticks) {
            cp1 = To_page_from_graph(cpt);
            cp2.x() = cp1.x() + 0.10;
            cp2.y() = cp1.y();
            SetWidth(msetting->Yaxis.ticks_width);
            SetRGB(msetting->Yaxis.axis_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Yaxis.numbers) {
            char numstr[20];
            SetRGB(msetting->Yaxis.numbers_color);
            cp1 = To_page_from_graph(cpt);
            cp1.x() = G_p.x() + 0.16;
            cp1.y() = cp1.y() + 0.1;
            double th = h;
            if (fabs(th) < 1.e-15)
                th = 0;
            sprintf(numstr, this->number_format, th);
            DrawText(cp1, numstr, Space::PAGE);
        }
    }

    // draw x axis line
    SetWidth(msetting->Xaxis.axis_width);
    SetRGB(msetting->Xaxis.axis_color);
    cp1 = org_g;
    cp2 = org_g;
    cp1.x() = lole_g.x();
    cp2.x() = upri_g.x();
    DrawLine(cp1, cp2, Space::GRAPH);

    // draw y axis line
    SetWidth(msetting->Yaxis.axis_width);
    SetRGB(msetting->Yaxis.axis_color);
    cp1 = org_g;
    cp2 = org_g;
    cp1.y() = lole_g.y();
    cp2.y() = upri_g.y();
    DrawLine(cp1, cp2, Space::GRAPH);

    // draw xy labels
    //if (msetting->Xaxis.label) { // pointers to static arrays are always TRUE
    cp1.x() = G_p.x() + Gs_p.x() - 0.4;
    cp1.y() = G_p.y() + 0.4;
    SetRGB(msetting->Xaxis.label_color);
    SetFont(ch_font_labels[msetting->Xaxis.label_fontname], msetting->Xaxis.label_fontsize);
    DrawText(cp1, msetting->Xaxis.label, Space::PAGE, Justification::RIGHT);
    //}
    //if (msetting->Yaxis.label) { // pointers to static arrays are always TRUE
    cp1.x() = G_p.x() + 0.7;
    cp1.y() = G_p.y() + Gs_p.y() - 0.3;
    SetRGB(msetting->Yaxis.label_color);
    SetFont(ch_font_labels[msetting->Yaxis.label_fontname], msetting->Yaxis.label_fontsize);
    DrawText(cp1, msetting->Yaxis.label, Space::PAGE);
    //}

    // restore old gfx mode -without the clipping region
    GrRestore();

    // draw enclosing frame
    SetGray(0.0);
    DrawRectangle(G_p, Gs_p, Space::PAGE, false);

    // draw title
    //if (msetting->title) // pointers to static arrays are always TRUE
    if (*msetting->title != 0) {
        SetFont(ch_font_labels[msetting->title_fontname], msetting->title_fontsize);
        SetRGB(msetting->title_color);
        cpt.x() = G_p.x() + 0.0;
        cpt.y() = G_p.y() + Gs_p.y() + 0.4;
        DrawText(cpt, msetting->title, Space::PAGE);
    }

    // return to original gfx mode
    GrRestore();
}